

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O3

bool __thiscall hwnet::Poller::Init(Poller *this,ThreadPool *pool)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  ThreadPool *this_00;
  notifyChannel *__p;
  bool bVar5;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  if (pool == (ThreadPool *)0x0) {
    this_00 = (ThreadPool *)operator_new(0xe0);
    (this_00->inited)._M_base._M_i = false;
    ThreadPool::TaskQueue::TaskQueue(&this_00->queue_);
    (this_00->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar4 = std::thread::hardware_concurrency();
    ThreadPool::Init(this_00,iVar4 * 2,0);
    LOCK();
    bVar5 = (this->inited)._M_base._M_i == false;
    if (bVar5) {
      (this->inited)._M_base._M_i = true;
    }
    UNLOCK();
    if (!bVar5) {
      ThreadPool::~ThreadPool(this_00);
      operator_delete(this_00,0xe0);
      return false;
    }
    this->pool_ = this_00;
    bVar5 = Epoll::Init(&this->poller_);
    if (bVar5) goto LAB_0011ac27;
    ThreadPool::~ThreadPool(this_00);
    operator_delete(this_00,0xe0);
  }
  else {
    LOCK();
    bVar5 = (this->inited)._M_base._M_i == false;
    if (bVar5) {
      (this->inited)._M_base._M_i = true;
    }
    UNLOCK();
    if (!bVar5) {
      return false;
    }
    this->pool_ = pool;
    bVar5 = Epoll::Init(&this->poller_);
    this_00 = pool;
    if (bVar5) {
LAB_0011ac27:
      __p = (notifyChannel *)operator_new(0x28);
      (__p->super_enable_shared_from_this<hwnet::Poller::notifyChannel>)._M_weak_this.
      super___weak_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__p->super_enable_shared_from_this<hwnet::Poller::notifyChannel>)._M_weak_this.
      super___weak_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__p->super_Channel)._vptr_Channel = (_func_int **)&PTR_OnActive_0012b808;
      std::__shared_ptr<hwnet::Poller::notifyChannel,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::Poller::notifyChannel,void>
                ((__shared_ptr<hwnet::Poller::notifyChannel,(__gnu_cxx::_Lock_policy)2> *)&local_38,
                 __p);
      p_Var3 = p_Stack_30;
      peVar2 = local_38;
      local_38 = (element_type *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->notifyChannel_).
               super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->notifyChannel_).
      super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      (this->notifyChannel_).
      super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = p_Var3;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
         p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
      iVar4 = notifyChannel::init((this->notifyChannel_).
                                  super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(EVP_PKEY_CTX *)this);
      if ((char)iVar4 == '\0') {
        if (pool == (ThreadPool *)0x0) {
          ThreadPool::~ThreadPool(this_00);
          operator_delete(this_00,0xe0);
        }
        this->pool_ = (ThreadPool *)0x0;
        p_Var1 = (this->notifyChannel_).
                 super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->notifyChannel_).
        super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (this->notifyChannel_).
        super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return false;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        return false;
      }
      this->poolCreateByNew = pool == (ThreadPool *)0x0;
      return true;
    }
  }
  this->pool_ = (ThreadPool *)0x0;
  return false;
}

Assistant:

bool Poller::Init(ThreadPool *pool) {

	auto poolCreateByNew_ = false;

	if(nullptr == pool) {
		pool = new ThreadPool;
		pool->Init(std::thread::hardware_concurrency()*2);
		poolCreateByNew_ = true;
	}

	bool expected = false;
	if(!this->inited.compare_exchange_strong(expected,true)) {
		if(poolCreateByNew_) {
			delete pool;
		}
		return false;
	}

	this->pool_ = pool;

	if(!poller_.Init()) {
		if(poolCreateByNew_) {
			delete pool;
		}
		this->pool_ = nullptr;	
		return false;
	}

	this->notifyChannel_ = notifyChannel::Ptr(new notifyChannel);

	if(!this->notifyChannel_->init(this)) {
		if(poolCreateByNew_) {
			delete pool;
		}
		this->pool_ = nullptr;	
		this->notifyChannel_ = nullptr;
		return false;
	}

	this->poolCreateByNew = poolCreateByNew_;

	return true;	
}